

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

ErrorType __thiscall
Network::Client::MQTTv5::disconnect(MQTTv5 *this,ReasonCodes code,Properties *properties)

{
  Impl *this_00;
  PropertyBase *pPVar1;
  ErrorType EVar2;
  ControlPacket<(Protocol::MQTT::Common::ControlPacketType)14,_false> packet;
  ControlPacketSerializable local_b0;
  undefined ***local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined2 local_94;
  undefined ***local_90;
  undefined ***local_88;
  undefined ***local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined **local_68;
  undefined ***local_60;
  undefined4 local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined **local_40;
  undefined **local_38;
  anon_union_4_2_f99d0578_for_VBInt_1 local_30;
  uint16 local_2c;
  PropertyBase *local_28;
  PropertyBase *pPStack_20;
  undefined **local_18;
  
  EVar2.errorCode = -4;
  if (0x7f < (int)code || (code & ~DisconnectWithWillMessage) == GrantedQoS0) {
    this_00 = this->impl;
    if (this_00->socket == (BaseSocket *)0x0) {
      EVar2.errorCode = 0;
    }
    else {
      local_a8 = &local_78;
      local_90 = &local_68;
      local_88 = &local_40;
      local_80 = &local_18;
      local_a0 = &PTR_getSize_00131a40;
      local_94 = 1;
      local_98 = 0;
      local_b0.super_Serializable._vptr_Serializable = (Serializable)&PTR_getSize_00132d80;
      local_70 = 0xe0;
      local_78 = &PTR_getType_00132c20;
      local_60 = &local_50;
      local_58 = 1;
      local_50 = &PTR_typeSize_00132cf8;
      local_68 = &PTR_getSize_00132c58;
      local_40 = &PTR_getSize_00132450;
      local_38 = &PTR_getSize_00131a40;
      local_2c = 1;
      local_30.value = local_30.value & 0xffffff00;
      pPStack_20 = (PropertyBase *)0x0;
      local_18 = &PTR_getSize_001324f8;
      local_48 = (undefined1)code;
      if (properties != (Properties *)0x0) {
        pPStack_20 = properties->head;
        local_30 = (properties->length).field_0;
        local_2c = (properties->length).size;
      }
      (this_00->super_ImplBase<Network::Client::MQTTv5::Impl>).state = Disconnecting;
      local_28 = pPStack_20;
      EVar2 = ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
                        (&this_00->super_ImplBase<Network::Client::MQTTv5::Impl>,&local_b0,false,
                         false);
      if (EVar2.errorCode == 0) {
        EVar2.errorCode = 0;
        ImplBase<Network::Client::MQTTv5::Impl>::close
                  (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
      }
      if ((local_28 != (PropertyBase *)0x0) && (local_28 != pPStack_20)) {
        do {
          pPVar1 = local_28->next;
          if (local_28->heapAllocated == true) {
            (*(local_28->super_Serializable)._vptr_Serializable[6])();
          }
        } while ((pPVar1 != (PropertyBase *)0x0) && (local_28 = pPVar1, pPVar1 != pPStack_20));
      }
    }
  }
  return (ErrorType)EVar2.errorCode;
}

Assistant:

MQTTv5::ErrorType MQTTv5::disconnect(const ReasonCodes code, Properties * properties)
    {
        if (code != ReasonCodes::NormalDisconnection && code != ReasonCodes::DisconnectWithWillMessage && code < ReasonCodes::UnspecifiedError)
            return ErrorType::BadParameter;


        if (!impl->isOpen()) return ErrorType::Success;

        Protocol::MQTT::V5::ControlPacket<Protocol::MQTT::V5::DISCONNECT> packet;
        packet.fixedVariableHeader.reasonCode = code;
        // Capture properties (to avoid copying them)
        packet.props.capture(properties);

#if MQTTAvoidValidation != 1
        if (!packet.props.checkPropertiesFor(Protocol::MQTT::V5::DISCONNECT))
            return ErrorType::BadProperties;
#endif

        impl->setConnectionState(State::Disconnecting);
        if (ErrorType ret = impl->prepareSAR(packet, false))
            return ret;

        // There is no need to wait for ACK for a disconnect
        impl->close();
        return ErrorType::Success;
    }